

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O2

argParserAdvancedConfiguration * __thiscall
argvParser::addArg(argvParser *this,string *argvShort,string *argvLong,string *help,
                  function<void_()> *callBack)

{
  vector<argParserAdvancedConfiguration::section*,std::allocator<argParserAdvancedConfiguration::section*>>
  *this_00;
  vector<argParserAdvancedConfiguration::argument*,std::allocator<argParserAdvancedConfiguration::argument*>>
  *this_01;
  bool bVar1;
  argument *paVar2;
  argument *local_138;
  function<void_()> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)argvShort);
  bVar1 = argParserAdvancedConfiguration::existArg
                    (&this->super_argParserAdvancedConfiguration,&local_50);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_70,(string *)argvLong);
    bVar1 = argParserAdvancedConfiguration::existArg
                      (&this->super_argParserAdvancedConfiguration,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_90,(string *)argvShort);
      bVar1 = argParserAdvancedConfiguration::existArg
                        (&this->super_argParserAdvancedConfiguration,&local_90);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        std::__cxx11::string::string((string *)&local_b0,(string *)argvLong);
        bVar1 = argParserAdvancedConfiguration::existArg
                          (&this->super_argParserAdvancedConfiguration,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        if (!bVar1) {
          this_00 = (vector<argParserAdvancedConfiguration::section*,std::allocator<argParserAdvancedConfiguration::section*>>
                     *)(this->super_argParserAdvancedConfiguration).newargconfig;
          paVar2 = (argument *)operator_new(0x28);
          (paVar2->argShort)._M_dataplus._M_p = (pointer)0x0;
          (paVar2->argShort)._M_string_length = 0;
          (paVar2->argShort).field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(paVar2->argShort).field_2 + 8) = 0;
          (paVar2->argLong)._M_dataplus._M_p = (pointer)0x0;
          argParserAdvancedConfiguration::section::section((section *)paVar2);
          local_138 = paVar2;
          std::
          vector<argParserAdvancedConfiguration::section*,std::allocator<argParserAdvancedConfiguration::section*>>
          ::emplace_back<argParserAdvancedConfiguration::section*>(this_00,(section **)&local_138);
        }
      }
      this_01 = (vector<argParserAdvancedConfiguration::argument*,std::allocator<argParserAdvancedConfiguration::argument*>>
                 *)(((this->super_argParserAdvancedConfiguration).newargconfig)->
                   super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish[-1]->arguments;
      paVar2 = (argument *)operator_new(0xf0);
      std::__cxx11::string::string((string *)&local_d0,(string *)argvShort);
      std::__cxx11::string::string((string *)&local_f0,(string *)argvLong);
      std::__cxx11::string::string((string *)&local_110,(string *)help);
      std::function<void_()>::function(&local_130,callBack);
      argParserAdvancedConfiguration::argument::argument
                (paVar2,&local_d0,&local_f0,&local_110,&local_130);
      local_138 = paVar2;
      std::
      vector<argParserAdvancedConfiguration::argument*,std::allocator<argParserAdvancedConfiguration::argument*>>
      ::emplace_back<argParserAdvancedConfiguration::argument*>(this_01,&local_138);
      std::_Function_base::~_Function_base(&local_130.super__Function_base);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      return &this->super_argParserAdvancedConfiguration;
    }
  }
  return (argParserAdvancedConfiguration *)0x0;
}

Assistant:

argParserAdvancedConfiguration * argvParser::addArg(string argvShort, string argvLong, string help, function<void()> callBack) {
    if (!existArg(argvShort) && !existArg(argvLong)) {
        if (!existArg(argvShort) && !existArg(argvLong)) {
            newargconfig->push_back(new section());
        }
        newargconfig->back()->arguments->push_back(new argument(argvShort, argvLong, help, callBack));
        return this;
    }
    return nullptr;
}